

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Demangle.cpp
# Opt level: O0

bool WTF::ParseBareFunctionType(State *state)

{
  bool bVar1;
  undefined1 local_48 [8];
  State copy;
  State *state_local;
  
  copy._40_8_ = state;
  memcpy(local_48,state,0x30);
  DisableAppend((State *)copy._40_8_);
  bVar1 = OneOrMore(ParseType,(State *)copy._40_8_);
  if (bVar1) {
    RestoreAppend((State *)copy._40_8_,(bool)(copy.prev_name._6_1_ & 1));
    MaybeAppend((State *)copy._40_8_,"()");
  }
  else {
    memcpy((void *)copy._40_8_,local_48,0x30);
  }
  return bVar1;
}

Assistant:

static bool ParseBareFunctionType(State *state) {
  State copy = *state;
  DisableAppend(state);
  if (OneOrMore(ParseType, state)) {
    RestoreAppend(state, copy.append);
    MaybeAppend(state, "()");
    return true;
  }
  *state = copy;
  return false;
}